

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_callback_helper.h
# Opt level: O0

VoidConstPtr __thiscall
miniros::
SubscriptionCallbackHelperT<const_std::shared_ptr<const_rosgraph_msgs::Clock_<std::allocator<void>_>_>_&,_void>
::deserialize(SubscriptionCallbackHelperT<const_std::shared_ptr<const_rosgraph_msgs::Clock_<std::allocator<void>_>_>_&,_void>
              *this,SubscriptionCallbackHelperDeserializeParams *params)

{
  bool bVar1;
  type_info *this_00;
  char *pcVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  VoidConstPtr VVar3;
  IStream stream;
  PreDeserializeParams<rosgraph_msgs::Clock_<std::allocator<void>_>_> predes_params;
  bool enabled;
  NonConstTypePtr msg;
  shared_ptr<rosgraph_msgs::Clock_<std::allocator<void>_>_> *in_stack_ffffffffffffff18;
  Level level;
  PreDeserializeParams<rosgraph_msgs::Clock_<std::allocator<void>_>_> *in_stack_ffffffffffffff20;
  function<std::shared_ptr<rosgraph_msgs::Clock_<std::allocator<void>_>_>_()>
  *in_stack_ffffffffffffff28;
  PreDeserializeParams<rosgraph_msgs::Clock_<std::allocator<void>_>_> *pPVar4;
  LogLocation *in_stack_ffffffffffffff30;
  void *logger_handle;
  undefined8 in_stack_ffffffffffffff40;
  Level LVar5;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  LogLocation *loc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  PreDeserializeParams<rosgraph_msgs::Clock_<std::allocator<void>_>_> local_80;
  undefined4 local_60;
  undefined1 local_5a;
  LogLocation local_59 [3];
  __shared_ptr local_28 [40];
  
  LVar5 = (Level)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  this_01 = in_RDI;
  std::function<std::shared_ptr<rosgraph_msgs::Clock_<std::allocator<void>_>_>_()>::operator()
            (in_stack_ffffffffffffff28);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_28);
  if (bVar1) {
    pPVar4 = &local_80;
    serialization::PreDeserializeParams<rosgraph_msgs::Clock_<std::allocator<void>_>_>::
    PreDeserializeParams(in_stack_ffffffffffffff20);
    std::shared_ptr<rosgraph_msgs::Clock_<std::allocator<void>_>_>::operator=
              (&in_stack_ffffffffffffff20->message,in_stack_ffffffffffffff18);
    std::
    shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator=((shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)in_stack_ffffffffffffff20,
                (shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)in_stack_ffffffffffffff18);
    serialization::PreDeserialize<rosgraph_msgs::Clock_<std::allocator<void>_>_>::notify(pPVar4);
    serialization::IStream::IStream
              ((IStream *)in_stack_ffffffffffffff20,(uint8_t *)in_stack_ffffffffffffff18,0);
    std::
    __shared_ptr_access<rosgraph_msgs::Clock_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator*((__shared_ptr_access<rosgraph_msgs::Clock_<std::allocator<void>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)in_stack_ffffffffffffff20);
    serialization::
    deserialize<rosgraph_msgs::Clock_<std::allocator<void>>,miniros::serialization::IStream>
              ((IStream *)in_stack_ffffffffffffff20,
               (Clock_<std::allocator<void>_> *)in_stack_ffffffffffffff18);
    std::shared_ptr<void_const>::shared_ptr<rosgraph_msgs::Clock_<std::allocator<void>>,void>
              ((shared_ptr<const_void> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    local_60 = 1;
    serialization::PreDeserializeParams<rosgraph_msgs::Clock_<std::allocator<void>_>_>::
    ~PreDeserializeParams(in_stack_ffffffffffffff20);
  }
  else {
    if (((console::g_initialized ^ 0xff) & 1) != 0) {
      console::initialize();
    }
    level = (Level)((ulong)in_stack_ffffffffffffff18 >> 0x20);
    if (((deserialize::loc.initialized_ ^ 0xffU) & 1) != 0) {
      loc = local_59;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_01,(char *)in_RDI,(allocator<char> *)loc);
      console::initializeLogLocation
                (loc,(string *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),LVar5);
      std::__cxx11::string::~string((string *)&local_59[0].logger_enabled_);
      std::allocator<char>::~allocator((allocator<char> *)local_59);
    }
    if (deserialize::loc.level_ != Debug) {
      console::setLogLocationLevel((LogLocation *)in_stack_ffffffffffffff20,level);
      console::checkLogLocationEnabled(in_stack_ffffffffffffff30);
    }
    LVar5 = deserialize::loc.level_;
    local_5a = (deserialize::loc.logger_enabled_ & 1U) != 0;
    if ((bool)local_5a) {
      logger_handle = deserialize::loc.logger_;
      this_00 = (type_info *)(**(code **)(*in_RSI + 0x20))();
      pcVar2 = std::type_info::name(this_00);
      console::print((FilterBase *)0x0,logger_handle,(Level)(ulong)LVar5,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/include/miniros/transport/subscription_callback_helper.h"
                     ,0x77,
                     "virtual VoidConstPtr miniros::SubscriptionCallbackHelperT<const std::shared_ptr<const rosgraph_msgs::Clock_<std::allocator<void>>> &>::deserialize(const SubscriptionCallbackHelperDeserializeParams &) [P = const std::shared_ptr<const rosgraph_msgs::Clock_<std::allocator<void>>> &, Enabled = void]"
                     ,"Allocation failed for message of type [%s]",pcVar2);
    }
    std::shared_ptr<const_void>::shared_ptr((shared_ptr<const_void> *)0x44eca9);
    local_60 = 1;
  }
  std::shared_ptr<rosgraph_msgs::Clock_<std::allocator<void>_>_>::~shared_ptr
            ((shared_ptr<rosgraph_msgs::Clock_<std::allocator<void>_>_> *)0x44ed88);
  VVar3.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  VVar3.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_01;
  return (VoidConstPtr)VVar3.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual VoidConstPtr deserialize(const SubscriptionCallbackHelperDeserializeParams& params)
  {
    namespace ser = serialization;

    NonConstTypePtr msg = create_();

    if (!msg)
    {
      MINIROS_DEBUG("Allocation failed for message of type [%s]", getTypeInfo().name());
      return VoidConstPtr();
    }

    ser::PreDeserializeParams<NonConstType> predes_params;
    predes_params.message = msg;
    predes_params.connection_header = params.connection_header;
    ser::PreDeserialize<NonConstType>::notify(predes_params);

    ser::IStream stream(params.buffer, params.length);
    ser::deserialize(stream, *msg);

    return VoidConstPtr(msg);
  }